

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_masked_sprite_16px_left(tgestate_t *state,uint8_t x)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  byte bVar19;
  byte *pbVar20;
  
  bVar9 = x - 4;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_right;
  lVar10 = 0;
  do {
    bVar7 = puVar2[lVar10 * 2];
    bVar11 = puVar2[lVar10 * 2 + 1];
    bVar15 = puVar3[lVar10 * 2];
    bVar19 = puVar3[lVar10 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar18 = (ulong)bVar7;
      uVar13 = (ulong)bVar15;
      bVar15 = state->reversed[bVar19];
      bVar19 = state->reversed[uVar13];
      bVar7 = state->reversed[bVar11];
      bVar11 = state->reversed[uVar18];
    }
    if (x == '\x04') {
      bVar16 = bVar19 * '\x02' + 1;
      bVar8 = bVar15 >> 7;
      bVar15 = bVar15 * '\x02' | bVar19 >> 7;
      bVar8 = bVar8 | 0xfe;
LAB_0010a983:
      bVar19 = bVar16 * '\x02' + 1;
      bVar16 = bVar15 * '\x02' | bVar16 >> 7;
      bVar8 = bVar8 * '\x02' | bVar15 >> 7;
      bVar5 = true;
LAB_0010a9a7:
      bVar6 = bVar5;
      bVar14 = bVar19 * '\x02' + 1;
      bVar15 = bVar16 * '\x02' | bVar19 >> 7;
      bVar8 = bVar8 * '\x02' | bVar16 >> 7;
      bVar5 = true;
LAB_0010a9cb:
      if (x == '\x04') {
        bVar16 = bVar7 >> 7;
        bVar7 = bVar7 * '\x02' | bVar11 >> 7;
        bVar11 = bVar11 * '\x02';
      }
      else {
        bVar16 = 0;
      }
      if (bVar6) {
        bVar16 = bVar16 * '\x02' | bVar7 >> 7;
        bVar7 = bVar7 * '\x02' | bVar11 >> 7;
        bVar11 = bVar11 * '\x02';
      }
      bVar12 = bVar7;
      bVar17 = bVar11;
      if (bVar5) {
        bVar17 = bVar11 * '\x02';
        bVar12 = bVar7 * '\x02' | bVar11 >> 7;
        bVar16 = bVar16 * '\x02' | bVar7 >> 7;
      }
      bVar19 = bVar14 * '\x02' + 1;
      bVar8 = bVar8 * '\x02' | bVar15 >> 7;
      bVar11 = bVar17 * '\x02';
      bVar7 = bVar12 * '\x02' | bVar17 >> 7;
      bVar17 = bVar16 * '\x02' | bVar12 >> 7;
      bVar15 = bVar15 * '\x02' | bVar14 >> 7;
    }
    else {
      bVar8 = 0xff;
      bVar16 = bVar19;
      if (bVar9 == 1) goto LAB_0010a983;
      bVar17 = 0;
      bVar6 = false;
      bVar16 = bVar15;
      bVar5 = false;
      if (bVar9 < 3) goto LAB_0010a9a7;
      bVar5 = false;
      bVar14 = bVar19;
      if (bVar9 == 3) goto LAB_0010a9cb;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar20 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_right_1 != '\0') {
      *pbVar20 = bVar17 & *pbVar4 | (bVar8 | ~*pbVar4) & *pbVar20;
    }
    if ((state->spriteplotter).enable_16_right_2 != '\0') {
      pbVar20[1] = bVar7 & pbVar4[1] | (bVar15 | ~pbVar4[1]) & pbVar20[1];
    }
    pbVar20 = pbVar20 + 2;
    if ((state->spriteplotter).enable_16_right_3 != '\0') {
      *pbVar20 = bVar11 & pbVar4[2] | (bVar19 | ~pbVar4[2]) & *pbVar20;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar20 + (long)state->columns + -2;
    lVar10 = lVar10 + 1;
    if (uVar1 == (uint8_t)lVar10) {
      return;
    }
  } while( true );
}

Assistant:

void plot_masked_sprite_16px_left(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x >= 4 && x < 8);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x -= 4; /* jump table offset (on input, x is 4..7) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_right; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    /* Note the different variable order to the right shifting case above. */
    uint8_t bm0, bm1, bm2;       /* was E, D, C */
    uint8_t mask0, mask1, mask2; /* was E', D', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm1 = *bitmapptr++;
    bm0 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask1 = *maskptr++;
    mask0 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask1, &mask0, &bm1, &bm0);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 1)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 2)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 3)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    // no carry reset in this variant?
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 1)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 2)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 3)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_right_1)
      *screenptr = MASK(bm2, mask2);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_right_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_right_3)
      *screenptr = MASK(bm0, mask0);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}